

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

pair<QDate,_QTime> getDateTime(QDateTimeData *d)

{
  long lVar1;
  uint uVar2;
  QDateTimePrivate *pQVar3;
  ulong uVar4;
  ulong uVar5;
  pair<QDate,_QTime> pVar6;
  
  if (((ulong)d & 1) == 0) {
    pQVar3 = d[1].d;
    d = (QDateTimeData *)(ulong)*(uint *)((long)d + 4);
  }
  else {
    pQVar3 = (QDateTimePrivate *)((long)d >> 8);
  }
  if ((long)pQVar3 < 0) {
    uVar5 = ~(ulong)pQVar3 / 86400000;
    uVar4 = ~uVar5;
    uVar2 = ((int)uVar5 * 86400000 - (int)~(ulong)pQVar3) + 86399999;
  }
  else {
    uVar4 = (ulong)pQVar3 / 86400000;
    uVar2 = (int)pQVar3 + (int)uVar4 * -86400000;
  }
  lVar1 = -0x8000000000000000;
  if (((ulong)d & 2) != 0) {
    lVar1 = uVar4 + 0x253d8c;
  }
  pVar6.second.mds = -(uint)(((ulong)d & 4) == 0) | uVar2;
  pVar6.first.jd = lVar1;
  pVar6._12_4_ = 0;
  return pVar6;
}

Assistant:

inline bool QDateTime::Data::isShort() const
{
    bool b = quintptr(d) & QDateTimePrivate::ShortData;

    // sanity check:
    Q_ASSERT(b || !d->m_status.testFlag(QDateTimePrivate::ShortData));

    // even if CanBeSmall = false, we have short data for a default-constructed
    // QDateTime object. But it's unlikely.
    if constexpr (CanBeSmall)
        return Q_LIKELY(b);
    return Q_UNLIKELY(b);
}